

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O2

void __thiscall jbcoin::ValidatorKeys::ValidatorKeys(ValidatorKeys *this,KeyType *keyType)

{
  KeyType type;
  Seed SStack_88;
  SecretKey *local_78;
  PublicKey *local_70;
  pair<jbcoin::PublicKey,_jbcoin::SecretKey> local_68;
  
  type = *keyType;
  this->keyType_ = type;
  (this->publicKey_).size_ = 0;
  this->tokenSequence_ = 0;
  this->revoked_ = false;
  randomSeed();
  generateKeyPair(&local_68,type,&SStack_88);
  local_70 = &this->publicKey_;
  local_78 = &this->secretKey_;
  std::tuple<jbcoin::PublicKey&,jbcoin::SecretKey&>::operator=
            ((tuple<jbcoin::PublicKey&,jbcoin::SecretKey&> *)&local_78,&local_68);
  SecretKey::~SecretKey(&local_68.second);
  Seed::~Seed(&SStack_88);
  return;
}

Assistant:

ValidatorKeys::ValidatorKeys (KeyType const& keyType)
    : keyType_ (keyType)
    , tokenSequence_ (0)
    , revoked_ (false)
{
    std::tie (publicKey_, secretKey_) = generateKeyPair (
        keyType_, randomSeed ());
}